

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O2

int __thiscall
helics::CommsInterface::connect(CommsInterface *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  thread *this_00;
  native_handle_type nVar1;
  bool bVar2;
  int iVar3;
  undefined7 uVar4;
  string_view message;
  string_view message_00;
  string_view message_01;
  size_type in_stack_ffffffffffffffa8;
  unique_lock<std::mutex> syncLock;
  thread local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  uVar4 = (undefined7)((ulong)this >> 8);
  if (((this->txStatus)._M_i == CONNECTED) && ((this->rxStatus)._M_i == CONNECTED)) {
    return (int)CONCAT71(uVar4,1);
  }
  if (((this->rxStatus)._M_i != STARTUP) || ((this->txStatus)._M_i != STARTUP)) {
    return 0;
  }
  if ((this->ActionCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
    message_00._M_str = "no callback specified, the receiver cannot start";
    message_00._M_len = 0x30;
    logError(this,message_00);
    return 0;
  }
  bVar2 = propertyLock(this);
  if (!bVar2) {
    if ((this->txStatus)._M_i != CONNECTED) {
      return 0;
    }
    return (int)CONCAT71(uVar4,(this->rxStatus)._M_i == CONNECTED);
  }
  std::unique_lock<std::mutex>::unique_lock(&syncLock,&this->threadSyncLock);
  if ((this->name)._M_string_length == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &this->localTargetAddress);
  }
  if ((this->localTargetAddress)._M_string_length == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &this->localTargetAddress,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->name);
  }
  if ((this->randomID)._M_string_length == 0) {
    gmlc::utilities::randomString_abi_cxx11_(in_stack_ffffffffffffffa8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->randomID,
               &local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (this->singleThread == false) {
    local_40._M_id._M_thread = (id)0;
    local_38._M_dataplus._M_p = (pointer)operator_new(0x10);
    *(undefined ***)local_38._M_dataplus._M_p = &PTR___State_004da188;
    *(CommsInterface **)((long)local_38._M_dataplus._M_p + 8) = this;
    std::thread::_M_start_thread(&local_40,&local_38,0);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
    CLI::std::thread::operator=((thread *)&this->queue_watcher,&local_40);
    CLI::std::thread::~thread(&local_40);
  }
  local_40._M_id._M_thread = (id)0;
  local_38._M_dataplus._M_p = (pointer)operator_new(0x10);
  *(undefined ***)local_38._M_dataplus._M_p = &PTR___State_004da1c8;
  *(CommsInterface **)((long)local_38._M_dataplus._M_p + 8) = this;
  std::thread::_M_start_thread(&local_40,&local_38,0);
  if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
  }
  this_00 = &this->queue_transmitter;
  CLI::std::thread::operator=((thread *)this_00,&local_40);
  CLI::std::thread::~thread(&local_40);
  std::unique_lock<std::mutex>::unlock(&syncLock);
  gmlc::concurrency::TriggerVariable::waitActivation(&this->txTrigger);
  gmlc::concurrency::TriggerVariable::waitActivation(&this->rxTrigger);
  if ((this->rxStatus)._M_i == CONNECTED) {
    if ((this->txStatus)._M_i == CONNECTED) {
      iVar3 = (int)CONCAT71(uVar4,1);
      goto LAB_0024c06e;
    }
    if (((this->requestDisconnect)._M_base._M_i & 1U) == 0) {
      message_01._M_str = "transmitter connection failure";
      message_01._M_len = 0x1e;
      logError(this,message_01);
    }
    if ((this->singleThread == false) && ((this->rxStatus)._M_i == CONNECTED)) {
      std::unique_lock<std::mutex>::lock(&syncLock);
      if ((this->queue_watcher)._M_id._M_thread != 0) {
        std::unique_lock<std::mutex>::unlock(&syncLock);
        (*this->_vptr_CommsInterface[7])(this);
        std::unique_lock<std::mutex>::lock(&syncLock);
        if ((this->queue_watcher)._M_id._M_thread != 0) {
          std::thread::join();
        }
      }
      std::unique_lock<std::mutex>::unlock(&syncLock);
    }
    std::unique_lock<std::mutex>::lock(&syncLock);
    nVar1 = (this_00->_M_id)._M_thread;
joined_r0x0024c062:
    if (nVar1 != 0) {
      std::thread::join();
    }
  }
  else {
    if (((this->requestDisconnect)._M_base._M_i & 1U) == 0) {
      message._M_str = "receiver connection failure";
      message._M_len = 0x1b;
      logError(this,message);
    }
    if ((this->txStatus)._M_i == CONNECTED) {
      std::unique_lock<std::mutex>::lock(&syncLock);
      if ((this_00->_M_id)._M_thread != 0) {
        std::unique_lock<std::mutex>::unlock(&syncLock);
        (*this->_vptr_CommsInterface[6])(this);
        std::unique_lock<std::mutex>::lock(&syncLock);
        if ((this_00->_M_id)._M_thread != 0) {
          std::thread::join();
        }
      }
      std::unique_lock<std::mutex>::unlock(&syncLock);
    }
    if (this->singleThread == false) {
      std::unique_lock<std::mutex>::lock(&syncLock);
      nVar1 = (this->queue_watcher)._M_id._M_thread;
      goto joined_r0x0024c062;
    }
  }
  iVar3 = 0;
LAB_0024c06e:
  std::unique_lock<std::mutex>::~unique_lock(&syncLock);
  return iVar3;
}

Assistant:

bool CommsInterface::connect()
{
    if (isConnected()) {
        return true;
    }
    if (rxStatus != ConnectionStatus::STARTUP) {
        return false;
    }
    if (txStatus != ConnectionStatus::STARTUP) {
        return false;
    }
    // bool exp = false;
    if (!ActionCallback) {
        logError("no callback specified, the receiver cannot start");
        return false;
    }
    if (!propertyLock()) {
        // this will lock all the properties and should not be unlocked;
        return isConnected();
    }
    std::unique_lock<std::mutex> syncLock(threadSyncLock);
    if (name.empty()) {
        name = localTargetAddress;
    }
    if (localTargetAddress.empty()) {
        localTargetAddress = name;
    }
    if (randomID.empty()) {
        randomID = gmlc::utilities::randomString(10);
    }
    if (!singleThread) {
        queue_watcher = std::thread([this] {
            try {
                queue_rx_function();
            }
            catch (const std::exception& e) {
                rxStatus = ConnectionStatus::ERRORED;
                logError(std::string("error in receiver >") + e.what());
            }
        });
    }

    queue_transmitter = std::thread([this] {
        try {
            queue_tx_function();
        }
        catch (const std::exception& e) {
            txStatus = ConnectionStatus::ERRORED;
            logError(std::string("error in transmitter >") + e.what());
        }
    });
    syncLock.unlock();
    txTrigger.waitActivation();
    rxTrigger.waitActivation();
    if (rxStatus != ConnectionStatus::CONNECTED) {
        if (!requestDisconnect.load()) {
            logError("receiver connection failure");
        }

        if (txStatus == ConnectionStatus::CONNECTED) {
            syncLock.lock();
            if (queue_transmitter.joinable()) {
                syncLock.unlock();
                closeTransmitter();
                syncLock.lock();
                if (queue_transmitter.joinable()) {
                    queue_transmitter.join();
                }
            }
            syncLock.unlock();
        }
        if (!singleThread) {
            syncLock.lock();
            if (queue_watcher.joinable()) {
                queue_watcher.join();
            }
        }
        return false;
    }

    if (txStatus != ConnectionStatus::CONNECTED) {
        if (!requestDisconnect.load()) {
            logError("transmitter connection failure");
        }
        if (!singleThread) {
            if (rxStatus == ConnectionStatus::CONNECTED) {
                syncLock.lock();
                if (queue_watcher.joinable()) {
                    syncLock.unlock();
                    closeReceiver();
                    syncLock.lock();
                    if (queue_watcher.joinable()) {
                        queue_watcher.join();
                    }
                }
                syncLock.unlock();
            }
        }
        syncLock.lock();
        if (queue_transmitter.joinable()) {
            queue_transmitter.join();
        }
        return false;
    }
    return true;
}